

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node*,Kernel::TypedTermList,bool,bool>
          (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *this,SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *a,Node *as,
          TypedTermList as_1,bool as_2,bool as_3)

{
  anon_class_40_5_898dd9c1 *in_R8;
  
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Kernel::TypedTermList,_bool,_bool>
  ::anon_class_40_5_898dd9c1::operator()(in_R8);
  return;
}

Assistant:

Recycled(A a, As... as) 
    : _self([&](){ 
        if (mem().isNonEmpty()) {
          auto elem = mem().pop();
          elem->init(std::move(a), std::move(as)...);
          return elem;
        } else {
          return IF_USE_PTRS(std::make_unique<T>, T)(std::move(a), std::move(as)...);
        }
    }())
  { }